

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_verify_hash(psa_key_handle_t handle,psa_algorithm_t alg,uint8_t *hash,size_t hash_length,
               uint8_t *signature,size_t signature_length)

{
  ushort uVar1;
  mbedtls_rsa_context *ctx;
  mbedtls_ecp_keypair *grp;
  psa_status_t pVar2;
  int ret;
  size_t sVar3;
  ulong buflen;
  mbedtls_mpi r;
  psa_key_slot_t *slot;
  mbedtls_mpi s;
  
  pVar2 = psa_get_key_from_slot(handle,&slot,0x800,alg);
  if (pVar2 != 0) {
    return pVar2;
  }
  uVar1 = (slot->attr).type;
  if ((uVar1 & 0xcfff) == 0x4001) {
    ctx = (slot->data).rsa;
    pVar2 = psa_rsa_decode_md_type(alg,hash_length,(mbedtls_md_type_t *)&r);
    if (pVar2 != 0) {
      return pVar2;
    }
    sVar3 = mbedtls_rsa_get_len(ctx);
    if (sVar3 != signature_length) {
      return -0x95;
    }
    if ((alg & 0xffffff00) == 0x10030000) {
      mbedtls_rsa_set_padding(ctx,1,r.s);
      ret = mbedtls_rsa_rsassa_pss_verify
                      (ctx,mbedtls_ctr_drbg_random,&global_data.ctr_drbg,0,MBEDTLS_MD_NONE,
                       (uint)hash_length,hash,signature);
    }
    else {
      if ((alg & 0xffffff00) != 0x10020000) {
        return -0x87;
      }
      mbedtls_rsa_set_padding(ctx,0,0);
      ret = mbedtls_rsa_pkcs1_verify
                      (ctx,mbedtls_ctr_drbg_random,&global_data.ctr_drbg,0,r.s,(uint)hash_length,
                       hash,signature);
    }
    if (ret == -0x4100) {
      return -0x95;
    }
  }
  else {
    if ((uVar1 & 0xcf00) != 0x4100) {
      return -0x86;
    }
    if ((alg & 0xfffeff00) != 0x10060000) {
      return -0x87;
    }
    grp = (slot->data).ecp;
    buflen = (grp->grp).pbits + 7 >> 3;
    mbedtls_mpi_init(&r);
    mbedtls_mpi_init(&s);
    if (buflen * 2 - signature_length != 0) {
      return -0x95;
    }
    ret = mbedtls_mpi_read_binary(&r,signature,buflen);
    if ((ret == 0) && (ret = mbedtls_mpi_read_binary(&s,signature + buflen,buflen), ret == 0)) {
      ret = mbedtls_ecdsa_verify(&grp->grp,hash,hash_length,&grp->Q,&r,&s);
    }
    mbedtls_mpi_free(&r);
    mbedtls_mpi_free(&s);
  }
  pVar2 = mbedtls_to_psa_error(ret);
  return pVar2;
}

Assistant:

psa_status_t psa_verify_hash( psa_key_handle_t handle,
                              psa_algorithm_t alg,
                              const uint8_t *hash,
                              size_t hash_length,
                              const uint8_t *signature,
                              size_t signature_length )
{
    psa_key_slot_t *slot;
    psa_status_t status;
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    const psa_drv_se_t *drv;
    psa_drv_se_context_t *drv_context;
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    status = psa_get_key_from_slot( handle, &slot, PSA_KEY_USAGE_VERIFY_HASH, alg );
    if( status != PSA_SUCCESS )
        return( status );

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( psa_get_se_driver( slot->attr.lifetime, &drv, &drv_context ) )
    {
        if( drv->asymmetric == NULL ||
            drv->asymmetric->p_verify == NULL )
            return( PSA_ERROR_NOT_SUPPORTED );
        return( drv->asymmetric->p_verify( drv_context,
                                           slot->data.se.slot_number,
                                           alg,
                                           hash, hash_length,
                                           signature, signature_length ) );
    }
    else
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
#if defined(MBEDTLS_RSA_C)
    if( PSA_KEY_TYPE_IS_RSA( slot->attr.type ) )
    {
        return( psa_rsa_verify( slot->data.rsa,
                                alg,
                                hash, hash_length,
                                signature, signature_length ) );
    }
    else
#endif /* defined(MBEDTLS_RSA_C) */
#if defined(MBEDTLS_ECP_C)
    if( PSA_KEY_TYPE_IS_ECC( slot->attr.type ) )
    {
#if defined(MBEDTLS_ECDSA_C)
        if( PSA_ALG_IS_ECDSA( alg ) )
            return( psa_ecdsa_verify( slot->data.ecp,
                                      hash, hash_length,
                                      signature, signature_length ) );
        else
#endif /* defined(MBEDTLS_ECDSA_C) */
        {
            return( PSA_ERROR_INVALID_ARGUMENT );
        }
    }
    else
#endif /* defined(MBEDTLS_ECP_C) */
    {
        return( PSA_ERROR_NOT_SUPPORTED );
    }
}